

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

void boost::filesystem::detail::directory_iterator_construct
               (directory_iterator *it,path *p,error_code *ec)

{
  bool bVar1;
  type pdVar2;
  type pdVar3;
  DIR *pDVar4;
  void *pvVar5;
  int *piVar6;
  int error_num;
  err_t error_num_00;
  string_type filename;
  char *local_a0;
  long local_98;
  char local_90 [16];
  path local_80;
  path local_60;
  file_status local_40;
  file_status local_38;
  
  error_num_00 = 0;
  if ((p->m_pathname)._M_string_length == 0) {
    error_num_00 = (anonymous_namespace)::not_found_error_code;
  }
  bVar1 = anon_unknown.dwarf_54f5::error
                    (error_num_00,p,ec,"boost::filesystem::directory_iterator::construct");
  if (bVar1) {
    return;
  }
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = '\0';
  pdVar2 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
  pdVar3 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
  pDVar4 = opendir((p->m_pathname)._M_dataplus._M_p);
  pdVar2->handle = pDVar4;
  if (pDVar4 == (DIR *)0x0) {
    piVar6 = __errno_location();
    error_num = *piVar6;
    system::system_category();
    if (error_num == 0) goto LAB_0010e03f;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,".",(allocator<char> *)&local_60);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    error_num = (anonymous_namespace)::ok;
    if ((anonymous_namespace)::ok == 0) {
      pvVar5 = malloc(0x1019);
      pdVar3->buffer = pvVar5;
LAB_0010e03f:
      pdVar2 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
      if (pdVar2->handle == (void *)0x0) {
        shared_ptr<boost::filesystem::detail::dir_itr_imp>::reset(&it->m_imp);
      }
      else {
        pdVar2 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
        std::__cxx11::string::string((string *)&local_60,(string *)&local_a0);
        operator/(&local_80,p,&local_60);
        local_38.m_value = status_error;
        local_38.m_perms = perms_not_known;
        local_40.m_value = status_error;
        local_40.m_perms = perms_not_known;
        directory_entry::assign(&pdVar2->dir_entry,&local_80,&local_38,&local_40);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        if ((*local_a0 == '.') && ((local_98 == 1 || ((local_98 == 2 && (local_a0[1] == '.')))))) {
          directory_iterator::increment(it,ec);
        }
      }
      goto LAB_0010e026;
    }
  }
  shared_ptr<boost::filesystem::detail::dir_itr_imp>::reset(&it->m_imp);
  anon_unknown.dwarf_54f5::error(error_num,p,ec,"boost::filesystem::directory_iterator::construct");
LAB_0010e026:
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void directory_iterator_construct(directory_iterator& it,
    const path& p, system::error_code* ec)    
  {
    if (error(p.empty() ? not_found_error_code.value() : 0, p, ec,
              "boost::filesystem::directory_iterator::construct"))
      return;

    path::string_type filename;
    file_status file_stat, symlink_file_stat;
    error_code result = dir_itr_first(it.m_imp->handle,
#     if defined(BOOST_POSIX_API)
      it.m_imp->buffer,
#     endif
      p.c_str(), filename, file_stat, symlink_file_stat);

    if (result)
    {
      it.m_imp.reset();
      error(result.value(), p,
        ec, "boost::filesystem::directory_iterator::construct");
      return;
    }
    
    if (it.m_imp->handle == 0)
      it.m_imp.reset(); // eof, so make end iterator
    else // not eof
    {
      it.m_imp->dir_entry.assign(p / filename, file_stat, symlink_file_stat);
      if (filename[0] == dot // dot or dot-dot
        && (filename.size()== 1
          || (filename[1] == dot
            && filename.size()== 2)))
        {  it.increment(*ec); }
    }
  }